

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalTestExpr(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  Fts3Expr *in_RDX;
  Fts3Cursor *in_RSI;
  long in_RDI;
  int *unaff_retaddr;
  Fts3Phrase *in_stack_00000008;
  Fts3Phrase *pPhrase;
  int bHit2;
  int bHit1;
  Fts3Expr *p;
  int bHit;
  bool local_44;
  byte local_43;
  bool local_42;
  bool local_41;
  Fts3Cursor *local_28;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar5;
  
  uVar5 = 1;
  if (in_RDX->eType == 0) {
    switch(*(undefined4 *)&(in_RSI->base).pVtab) {
    case 1:
    case 3:
      iVar4 = fts3EvalTestExpr(in_RSI,in_RDX,(int *)CONCAT44(1,in_stack_ffffffffffffffe0));
      local_41 = false;
      local_28 = in_RSI;
      if (iVar4 != 0) {
        iVar4 = fts3EvalTestExpr(in_RSI,in_RDX,(int *)CONCAT44(uVar5,in_stack_ffffffffffffffe0));
        local_41 = false;
        local_28 = in_RSI;
        if (iVar4 != 0) {
          iVar4 = fts3EvalNearTest((Fts3Expr *)in_stack_00000008,unaff_retaddr);
          local_41 = iVar4 != 0;
          local_28 = in_RSI;
        }
      }
      uVar5 = (uint)local_41;
      if (((uVar5 == 0) && (*(int *)&(local_28->base).pVtab == 1)) &&
         ((lVar2._0_2_ = local_28->eSearch, lVar2._2_1_ = local_28->isEof,
          lVar2._3_1_ = local_28->isRequireSeek, lVar2._4_1_ = local_28->bSeekStmt,
          lVar2._5_3_ = *(undefined3 *)&local_28->field_0xd, lVar2 == 0 ||
          (**(int **)&local_28->eSearch != 1)))) {
        for (; lVar1._0_4_ = local_28->iLangid, lVar1._4_4_ = local_28->nPhrase, lVar1 == 0;
            local_28 = (Fts3Cursor *)local_28->pStmt) {
          if (local_28->pExpr->iDocid == *(long *)(in_RDI + 0x30)) {
            fts3EvalInvalidatePoslist((Fts3Phrase *)0x2526be);
          }
        }
        if (local_28->pDeferred == *(Fts3DeferredToken **)(in_RDI + 0x30)) {
          fts3EvalInvalidatePoslist((Fts3Phrase *)0x2526f2);
        }
      }
      break;
    case 2:
      iVar4 = fts3EvalTestExpr(in_RSI,in_RDX,(int *)CONCAT44(1,in_stack_ffffffffffffffe0));
      local_43 = 0;
      if (iVar4 != 0) {
        iVar4 = fts3EvalTestExpr(in_RSI,in_RDX,(int *)CONCAT44(uVar5,in_stack_ffffffffffffffe0));
        local_43 = iVar4 != 0 ^ 0xff;
      }
      uVar5 = (uint)(local_43 & 1);
      break;
    case 4:
      iVar4 = fts3EvalTestExpr(in_RSI,in_RDX,(int *)CONCAT44(1,in_stack_ffffffffffffffe0));
      iVar3 = fts3EvalTestExpr(in_RSI,in_RDX,(int *)CONCAT44(uVar5,in_stack_ffffffffffffffe0));
      local_42 = iVar4 != 0 || iVar3 != 0;
      uVar5 = (uint)local_42;
      break;
    default:
      if ((*(long *)(in_RDI + 0x28) == 0) ||
         ((*(char *)((long)&in_RSI->iPrevId + 2) == '\0' &&
          ((in_RSI->pDeferred != *(Fts3DeferredToken **)(in_RDI + 0x30) ||
           (*(long *)(*(long *)&in_RSI->iLangid + 0x28) == 0)))))) {
        local_44 = false;
        if (((char)in_RSI->iPrevId == '\0') &&
           (local_44 = false, in_RSI->pDeferred == *(Fts3DeferredToken **)(in_RDI + 0x30))) {
          local_44 = 0 < *(int *)(*(long *)&in_RSI->iLangid + 0x30);
        }
      }
      else {
        lVar2 = *(long *)&in_RSI->iLangid;
        if (*(char *)((long)&in_RSI->iPrevId + 2) != '\0') {
          fts3EvalInvalidatePoslist((Fts3Phrase *)0x25281c);
        }
        iVar4 = fts3EvalDeferredPhrase((Fts3Cursor *)pPhrase,in_stack_00000008);
        in_RDX->eType = iVar4;
        local_44 = *(long *)(lVar2 + 0x28) != 0;
        in_RSI->pDeferred = *(Fts3DeferredToken **)(in_RDI + 0x30);
      }
      uVar5 = (uint)local_44;
    }
  }
  return uVar5;
}

Assistant:

static int fts3EvalTestExpr(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Expr to test. May or may not be root. */
  int *pRc                        /* IN/OUT: Error code */
){
  int bHit = 1;                   /* Return value */
  if( *pRc==SQLITE_OK ){
    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
         && fts3EvalNearTest(pExpr, pRc)
        );

        /* If the NEAR expression does not match any rows, zero the doclist for
        ** all phrases involved in the NEAR. This is because the snippet(),
        ** offsets() and matchinfo() functions are not supposed to recognize
        ** any instances of phrases that are part of unmatched NEAR queries.
        ** For example if this expression:
        **
        **    ... MATCH 'a OR (b NEAR c)'
        **
        ** is matched against a row containing:
        **
        **        'a b d e'
        **
        ** then any snippet() should ony highlight the "a" term, not the "b"
        ** (as "b" is part of a non-matching NEAR clause).
        */
        if( bHit==0
         && pExpr->eType==FTSQUERY_NEAR
         && (pExpr->pParent==0 || pExpr->pParent->eType!=FTSQUERY_NEAR)
        ){
          Fts3Expr *p;
          for(p=pExpr; p->pPhrase==0; p=p->pLeft){
            if( p->pRight->iDocid==pCsr->iPrevId ){
              fts3EvalInvalidatePoslist(p->pRight->pPhrase);
            }
          }
          if( p->iDocid==pCsr->iPrevId ){
            fts3EvalInvalidatePoslist(p->pPhrase);
          }
        }

        break;

      case FTSQUERY_OR: {
        int bHit1 = fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc);
        int bHit2 = fts3EvalTestExpr(pCsr, pExpr->pRight, pRc);
        bHit = bHit1 || bHit2;
        break;
      }

      case FTSQUERY_NOT:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && !fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
        );
        break;

      default: {
#ifndef SQLITE_DISABLE_FTS4_DEFERRED
        if( pCsr->pDeferred && (pExpr->bDeferred || (
            pExpr->iDocid==pCsr->iPrevId && pExpr->pPhrase->doclist.pList
        ))){
          Fts3Phrase *pPhrase = pExpr->pPhrase;
          if( pExpr->bDeferred ){
            fts3EvalInvalidatePoslist(pPhrase);
          }
          *pRc = fts3EvalDeferredPhrase(pCsr, pPhrase);
          bHit = (pPhrase->doclist.pList!=0);
          pExpr->iDocid = pCsr->iPrevId;
        }else
#endif
        {
          bHit = (
              pExpr->bEof==0 && pExpr->iDocid==pCsr->iPrevId
           && pExpr->pPhrase->doclist.nList>0
          );
        }
        break;
      }
    }
  }
  return bHit;
}